

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchData::ReleaseWaiterWithoutBlocking
          (CSynchData *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  bool bVar1;
  FILE *pFVar2;
  SignalingSemantics SVar3;
  OwnershipSemantics OVar4;
  ThreadReleaseSemantics TVar5;
  LONG LVar6;
  uint uVar7;
  CObjectType *this_00;
  bool fReenteringObjWithOwnership;
  ThreadReleaseSemantics trsThreadReleaseSemantics;
  OwnershipSemantics osOwnershipSemantics;
  SignalingSemantics ssSignalingSemantics;
  CObjectType *potObjectType;
  PAL_ERROR palErr;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  CSynchData *this_local;
  
  potObjectType._4_4_ = 0;
  this_00 = GetObjectType(this);
  SVar3 = CObjectType::GetSignalingSemantics(this_00);
  OVar4 = CObjectType::GetOwnershipSemantics(this_00);
  TVar5 = CObjectType::GetThreadReleaseSemantics(this_00);
  bVar1 = false;
  if (SVar3 == SignalingNotApplicable) {
    fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x360);
    fprintf(_stderr,
            "Expression: CObjectType::SignalingNotApplicable != ssSignalingSemantics, Description: Signaling not applicable"
           );
  }
  if (TVar5 == ThreadReleaseNotApplicable) {
    fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x363);
    fprintf(_stderr,
            "Expression: CObjectType::ThreadReleaseNotApplicable != trsThreadReleaseSemantics, Description: Thread releasing not applicable"
           );
  }
  if ((SVar3 == SingleTransitionObject) &&
     ((TVar5 != ThreadReleaseHasNoSideEffects || (OVar4 != NoOwner)))) {
    fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x36b);
    fprintf(_stderr,
            "Expression: CObjectType::SingleTransitionObject != ssSignalingSemantics || (CObjectType::ThreadReleaseHasNoSideEffects == trsThreadReleaseSemantics && CObjectType::NoOwner == osOwnershipSemantics), Description: Conflicting object synchronization attributes [SignalingSemantics=%u OwnershipSemantics=%u ThreadReleaseSemantics=%u]\n"
            ,1,(ulong)OVar4,(ulong)TVar5);
  }
  if ((OVar4 == OwnershipTracked) && (LVar6 = GetOwnershipCount(this), 0 < LVar6)) {
    bVar1 = true;
  }
  if ((!bVar1) && (TVar5 == ThreadReleaseAltersSignalCount)) {
    LVar6 = GetSignalCount(this);
    if (LVar6 < 1) {
      fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x37b);
      pFVar2 = _stderr;
      uVar7 = GetSignalCount(this);
      fprintf(pFVar2,
              "Expression: 0 < GetSignalCount(), Description: Internal error: operation would make signal count negative - object should be signaled at this time [signal count=%d]"
              ,(ulong)uVar7);
    }
    if ((OVar4 == OwnershipTracked) && (LVar6 = GetSignalCount(this), LVar6 != 1)) {
      fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x380);
      pFVar2 = _stderr;
      uVar7 = GetSignalCount(this);
      fprintf(pFVar2,
              "Expression: CObjectType::OwnershipTracked != osOwnershipSemantics || 1 == GetSignalCount(), Description: Ownable objects cannot have signal count greater than zero [current SignalCount=%d]\n"
              ,(ulong)uVar7);
    }
    DecrementSignalCount(this);
  }
  if (OVar4 == OwnershipTracked) {
    LVar6 = GetOwnershipCount(this);
    if ((LVar6 != 0) && (LVar6 = GetSignalCount(this), LVar6 != 0)) {
      fprintf(_stderr,"] %s %s:%d","ReleaseWaiterWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x38a);
      fprintf(_stderr,
              "Expression: 0 == GetOwnershipCount() || 0 == GetSignalCount(), Description: OwnershipCount and SignalCount with conflicting values\n"
             );
    }
    potObjectType._4_4_ = AssignOwnershipToThread(this,pthrCurrent,pthrTarget);
    if ((potObjectType._4_4_ != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
      abort();
    }
  }
  return potObjectType._4_4_;
}

Assistant:

PAL_ERROR CSynchData::ReleaseWaiterWithoutBlocking(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        VALIDATEOBJECT(this);
        
        PAL_ERROR palErr = NO_ERROR;
        CObjectType * potObjectType = GetObjectType();
#ifdef _DEBUG
        CObjectType::SignalingSemantics ssSignalingSemantics = 
            potObjectType->GetSignalingSemantics();
#endif // _DEBUG
        CObjectType::OwnershipSemantics osOwnershipSemantics = 
            potObjectType->GetOwnershipSemantics();
        CObjectType::ThreadReleaseSemantics trsThreadReleaseSemantics =
            potObjectType->GetThreadReleaseSemantics();
        bool fReenteringObjWithOwnership = false;
        
        _ASSERT_MSG(CObjectType::SignalingNotApplicable != ssSignalingSemantics,
                    "Signaling not applicable");
        _ASSERT_MSG(CObjectType::ThreadReleaseNotApplicable != 
                    trsThreadReleaseSemantics,
                    "Thread releasing not applicable");        
        _ASSERT_MSG(CObjectType::SingleTransitionObject != ssSignalingSemantics ||
                    (CObjectType::ThreadReleaseHasNoSideEffects == 
                     trsThreadReleaseSemantics &&
                     CObjectType::NoOwner == osOwnershipSemantics),
                    "Conflicting object synchronization attributes "
                    "[SignalingSemantics=%u OwnershipSemantics=%u "
                    "ThreadReleaseSemantics=%u]\n", ssSignalingSemantics,
                    osOwnershipSemantics, trsThreadReleaseSemantics);

        if (CObjectType::OwnershipTracked == osOwnershipSemantics && 
            0 < GetOwnershipCount())
        {
            // We are rentering an object with ownership: we need to skip
            // the object unsignaling 
            fReenteringObjWithOwnership = true;
        }
    
        if (!fReenteringObjWithOwnership &&
            CObjectType::ThreadReleaseAltersSignalCount == trsThreadReleaseSemantics)
        {
            _ASSERT_MSG(0 < GetSignalCount(),
                        "Internal error: operation would make signal count "
                        "negative - object should be signaled at this time "
                        "[signal count=%d]", GetSignalCount());
            _ASSERT_MSG(CObjectType::OwnershipTracked != osOwnershipSemantics || 
                        1 == GetSignalCount(), 
                        "Ownable objects cannot have signal count greater "
                        "than zero [current SignalCount=%d]\n",
                        GetSignalCount());

            // Unsignal the object
            DecrementSignalCount();
        }

        if (CObjectType::OwnershipTracked == osOwnershipSemantics)
        {
            _ASSERT_MSG(0 == GetOwnershipCount() || 0 == GetSignalCount(),
                        "OwnershipCount and SignalCount with conflicting "
                        "values\n");
            
            // Take ownership or increment ownership count.            
            // We do this after the object unsignaling to minimize possibilities
            // of having both SignalCount and OwnershipCount greater than zero
            // (see comment in AssignOwnershipToThread)
            palErr = AssignOwnershipToThread(pthrCurrent, pthrTarget);
            
            if (NO_ERROR != palErr)
            {
                ERROR("AssignOwnershipToThread failed with error %u; "
                      "ownership data on object with SynchData {shrid=%p p=%p} "
                      "may be corrupted\n", palErr, (void *)m_shridThis, this);
            }
        }        
        
#ifdef SYNCH_STATISTICS
        if (NO_ERROR == palErr)
        {
            IncrementStatWaitCount();
        }
#endif
        return palErr;

    }